

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtoolbox.cpp
# Opt level: O0

void __thiscall QToolBoxPrivate::_q_buttonClicked(QToolBoxPrivate *this)

{
  bool bVar1;
  QToolBoxButton *pQVar2;
  iterator this_00;
  pointer pPVar3;
  QToolBoxPrivate *in_RDI;
  long in_FS_OFFSET;
  unique_ptr<QToolBoxPrivate::Page,_std::default_delete<QToolBoxPrivate::Page>_> *page;
  PageList *__range1;
  QWidget *item;
  QToolBoxButton *tb;
  QToolBox *q;
  iterator __end1;
  iterator __begin1;
  __normal_iterator<std::unique_ptr<QToolBoxPrivate::Page,_std::default_delete<QToolBoxPrivate::Page>_>_*,_std::vector<std::unique_ptr<QToolBoxPrivate::Page,_std::default_delete<QToolBoxPrivate::Page>_>,_std::allocator<std::unique_ptr<QToolBoxPrivate::Page,_std::default_delete<QToolBoxPrivate::Page>_>_>_>_>
  *in_stack_ffffffffffffffa8;
  reference in_stack_ffffffffffffffb8;
  int index;
  PageList *this_01;
  QToolBoxPrivate *widget;
  __normal_iterator<std::unique_ptr<QToolBoxPrivate::Page,_std::default_delete<QToolBoxPrivate::Page>_>_*,_std::vector<std::unique_ptr<QToolBoxPrivate::Page,_std::default_delete<QToolBoxPrivate::Page>_>,_std::allocator<std::unique_ptr<QToolBoxPrivate::Page,_std::default_delete<QToolBoxPrivate::Page>_>_>_>_>
  local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  widget = in_RDI;
  q_func(in_RDI);
  QObject::sender();
  pQVar2 = qobject_cast<QToolBoxButton*>((QObject *)0x7039b1);
  this_01 = &in_RDI->pageList;
  local_10._M_current =
       (unique_ptr<QToolBoxPrivate::Page,_std::default_delete<QToolBoxPrivate::Page>_> *)
       &DAT_aaaaaaaaaaaaaaaa;
  local_10._M_current =
       (unique_ptr<QToolBoxPrivate::Page,_std::default_delete<QToolBoxPrivate::Page>_> *)
       std::
       vector<std::unique_ptr<QToolBoxPrivate::Page,_std::default_delete<QToolBoxPrivate::Page>_>,_std::allocator<std::unique_ptr<QToolBoxPrivate::Page,_std::default_delete<QToolBoxPrivate::Page>_>_>_>
       ::begin((vector<std::unique_ptr<QToolBoxPrivate::Page,_std::default_delete<QToolBoxPrivate::Page>_>,_std::allocator<std::unique_ptr<QToolBoxPrivate::Page,_std::default_delete<QToolBoxPrivate::Page>_>_>_>
                *)in_RDI);
  this_00 = std::
            vector<std::unique_ptr<QToolBoxPrivate::Page,_std::default_delete<QToolBoxPrivate::Page>_>,_std::allocator<std::unique_ptr<QToolBoxPrivate::Page,_std::default_delete<QToolBoxPrivate::Page>_>_>_>
            ::end((vector<std::unique_ptr<QToolBoxPrivate::Page,_std::default_delete<QToolBoxPrivate::Page>_>,_std::allocator<std::unique_ptr<QToolBoxPrivate::Page,_std::default_delete<QToolBoxPrivate::Page>_>_>_>
                   *)in_RDI);
  do {
    index = (int)((ulong)in_stack_ffffffffffffffb8 >> 0x20);
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<std::unique_ptr<QToolBoxPrivate::Page,_std::default_delete<QToolBoxPrivate::Page>_>_*,_std::vector<std::unique_ptr<QToolBoxPrivate::Page,_std::default_delete<QToolBoxPrivate::Page>_>,_std::allocator<std::unique_ptr<QToolBoxPrivate::Page,_std::default_delete<QToolBoxPrivate::Page>_>_>_>_>
                        *)in_RDI,in_stack_ffffffffffffffa8);
    if (!bVar1) {
LAB_00703a81:
      QToolBox::indexOf((QToolBox *)this_00._M_current,(QWidget *)widget);
      QToolBox::setCurrentIndex((QToolBox *)this_01,index);
      if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
        __stack_chk_fail();
      }
      return;
    }
    in_stack_ffffffffffffffb8 =
         __gnu_cxx::
         __normal_iterator<std::unique_ptr<QToolBoxPrivate::Page,_std::default_delete<QToolBoxPrivate::Page>_>_*,_std::vector<std::unique_ptr<QToolBoxPrivate::Page,_std::default_delete<QToolBoxPrivate::Page>_>,_std::allocator<std::unique_ptr<QToolBoxPrivate::Page,_std::default_delete<QToolBoxPrivate::Page>_>_>_>_>
         ::operator*(&local_10);
    pPVar3 = std::unique_ptr<QToolBoxPrivate::Page,_std::default_delete<QToolBoxPrivate::Page>_>::
             operator->((unique_ptr<QToolBoxPrivate::Page,_std::default_delete<QToolBoxPrivate::Page>_>
                         *)0x703a54);
    index = (int)((ulong)in_stack_ffffffffffffffb8 >> 0x20);
    if (pPVar3->button == pQVar2) {
      std::unique_ptr<QToolBoxPrivate::Page,_std::default_delete<QToolBoxPrivate::Page>_>::
      operator->((unique_ptr<QToolBoxPrivate::Page,_std::default_delete<QToolBoxPrivate::Page>_> *)
                 0x703a68);
      goto LAB_00703a81;
    }
    __gnu_cxx::
    __normal_iterator<std::unique_ptr<QToolBoxPrivate::Page,_std::default_delete<QToolBoxPrivate::Page>_>_*,_std::vector<std::unique_ptr<QToolBoxPrivate::Page,_std::default_delete<QToolBoxPrivate::Page>_>,_std::allocator<std::unique_ptr<QToolBoxPrivate::Page,_std::default_delete<QToolBoxPrivate::Page>_>_>_>_>
    ::operator++(&local_10);
  } while( true );
}

Assistant:

void QToolBoxPrivate::_q_buttonClicked()
{
    Q_Q(QToolBox);
    QToolBoxButton *tb = qobject_cast<QToolBoxButton*>(q->sender());
    QWidget* item = nullptr;
    for (const auto &page : pageList) {
        if (page->button == tb) {
            item = page->widget;
            break;
        }
    }

    q->setCurrentIndex(q->indexOf(item));
}